

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

IssuanceParameter * __thiscall
cfd::ConfidentialTransactionController::SetAssetIssuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransactionController *this,
          Txid *txid,uint32_t vout,Amount *asset_amount,Script *asset_locking_script,
          ByteData *asset_nonce,Amount *token_amount,Script *token_locking_script,
          ByteData *token_nonce,bool is_blind,ByteData256 *contract_hash,bool is_random_sort,
          bool is_remove_nonce)

{
  uint32_t tx_in_index;
  ConfidentialTransaction *this_00;
  IssuanceParameter local_f8;
  Script *local_88;
  ConfidentialNonce confidential_token_nonce;
  ConfidentialNonce confidential_asset_nonce;
  
  this_00 = &this->transaction_;
  local_88 = asset_locking_script;
  tx_in_index = core::ConfidentialTransaction::GetTxInIndex(this_00,txid,vout);
  core::ConfidentialNonce::ConfidentialNonce(&confidential_asset_nonce);
  core::ConfidentialNonce::ConfidentialNonce(&confidential_token_nonce);
  if (!is_remove_nonce) {
    core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&local_f8,asset_nonce);
    core::ConfidentialNonce::operator=(&confidential_asset_nonce,(ConfidentialNonce *)&local_f8);
    local_f8.entropy._vptr_BlindFactor = (_func_int **)&PTR__ConfidentialNonce_0087cc78;
    if (local_f8.entropy.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.entropy.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.entropy.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.entropy.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&local_f8,token_nonce);
    core::ConfidentialNonce::operator=(&confidential_token_nonce,(ConfidentialNonce *)&local_f8);
    local_f8.entropy._vptr_BlindFactor = (_func_int **)&PTR__ConfidentialNonce_0087cc78;
    if (local_f8.entropy.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.entropy.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.entropy.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.entropy.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  core::BlindFactor::BlindFactor(&__return_storage_ptr__->entropy);
  core::ConfidentialAssetId::ConfidentialAssetId(&__return_storage_ptr__->asset);
  core::ConfidentialAssetId::ConfidentialAssetId(&__return_storage_ptr__->token);
  core::ConfidentialTransaction::SetAssetIssuance
            (&local_f8,this_00,tx_in_index,asset_amount,local_88,&confidential_asset_nonce,
             token_amount,token_locking_script,&confidential_token_nonce,is_blind,contract_hash);
  core::BlindFactor::operator=(&__return_storage_ptr__->entropy,&local_f8.entropy);
  core::ConfidentialAssetId::operator=(&__return_storage_ptr__->asset,&local_f8.asset);
  core::ConfidentialAssetId::operator=(&__return_storage_ptr__->token,&local_f8.token);
  local_f8.token._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0087ccc8;
  if (local_f8.token.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.token.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.token.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.token.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_f8.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0087ccc8;
  if (local_f8.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.asset.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.asset.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.asset.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_f8.entropy._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0087ca68;
  if (local_f8.entropy.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.entropy.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.entropy.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.entropy.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (is_random_sort) {
    core::ConfidentialTransaction::RandomSortTxOut(this_00);
  }
  confidential_token_nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0087cc78;
  if (confidential_token_nonce.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(confidential_token_nonce.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)confidential_token_nonce.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)confidential_token_nonce.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  confidential_asset_nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0087cc78;
  if (confidential_asset_nonce.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(confidential_asset_nonce.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)confidential_asset_nonce.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)confidential_asset_nonce.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

IssuanceParameter ConfidentialTransactionController::SetAssetIssuance(
    const Txid& txid, uint32_t vout, const Amount& asset_amount,
    const Script& asset_locking_script, const ByteData& asset_nonce,
    const Amount& token_amount, const Script& token_locking_script,
    const ByteData& token_nonce, bool is_blind,
    const ByteData256& contract_hash, bool is_random_sort,
    bool is_remove_nonce) {
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);

  ConfidentialNonce confidential_asset_nonce;
  ConfidentialNonce confidential_token_nonce;
  if (!is_remove_nonce) {
    confidential_asset_nonce = ConfidentialNonce(asset_nonce);
    confidential_token_nonce = ConfidentialNonce(token_nonce);
  }

  IssuanceParameter param;
  param = transaction_.SetAssetIssuance(
      txin_index, asset_amount, asset_locking_script, confidential_asset_nonce,
      token_amount, token_locking_script, confidential_token_nonce, is_blind,
      contract_hash);
  if (is_random_sort) {
    RandomSortTxOut();
  }
  return param;
}